

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O0

void __thiscall WindowHandleData::~WindowHandleData(WindowHandleData *this)

{
  WindowHandleData *this_local;
  
  if ((this->w != 0) && (this->h != 0)) {
    free(this->bytes);
  }
  if (this->display != (Display *)0x0) {
    (*(this->im->f).destroy_image)(this->im);
    XFreePixmap(this->display,this->pix);
    XCloseDisplay(this->display);
  }
  std::condition_variable::~condition_variable(&this->cv);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr(&this->t);
  return;
}

Assistant:

~WindowHandleData()
    {
#ifdef _WIN32
    if (w != 0 && h != 0)
      free(bytes);
#else      
    if (w != 0 && h != 0)
      free(bytes);

    if (display)
      {    
      XDestroyImage(im);
      XFreePixmap(display, pix);
      XCloseDisplay(display);
      }
#endif
    }